

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Gia_Man_t * Gia_ManDupMuxes(Gia_Man_t *p,int Limit)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pGVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  uint *puVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  bool bVar12;
  int local_5c;
  int i;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pSiblNew;
  Gia_Obj_t *pFanC;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *pGStack_10;
  int Limit_local;
  Gia_Man_t *p_local;
  
  pNew._4_4_ = Limit;
  pGStack_10 = p;
  if (p->pMuxes != (uint *)0x0) {
    __assert_fail("p->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x67,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
  }
  if (Limit < 0) {
    __assert_fail("Limit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x68,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    pGStack_10->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGStack_10);
  iVar3 = Gia_ManObjNum(pGStack_10);
  pTemp = Gia_ManStart(iVar3);
  pcVar7 = Abc_UtilStrsav(pGStack_10->pName);
  pTemp->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(pGStack_10->pSpec);
  pTemp->pSpec = pcVar7;
  puVar8 = (uint *)calloc((long)pTemp->nObjsAlloc,4);
  pTemp->pMuxes = puVar8;
  iVar3 = Gia_ManHasChoices(pGStack_10);
  if (iVar3 != 0) {
    piVar9 = (int *)calloc((long)pTemp->nObjsAlloc,4);
    pTemp->pSibls = piVar9;
  }
  pGVar10 = Gia_ManConst0(pGStack_10);
  pGVar10->Value = 0;
  Gia_ManHashStart(pTemp);
  local_5c = 1;
  do {
    bVar12 = false;
    if (local_5c < pGStack_10->nObjs) {
      pFan0 = Gia_ManObj(pGStack_10,local_5c);
      bVar12 = pFan0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar12) {
      Gia_ManHashStop(pTemp);
      pGVar1 = pTemp;
      iVar3 = Gia_ManRegNum(pGStack_10);
      Gia_ManSetRegNum(pGVar1,iVar3);
      pObj = (Gia_Obj_t *)pTemp;
      pTemp = Gia_ManCleanup(pTemp);
      Gia_ManStop((Gia_Man_t *)pObj);
      return pTemp;
    }
    iVar3 = Gia_ObjIsCi(pFan0);
    if (iVar3 == 0) {
      iVar3 = Gia_ObjIsCo(pFan0);
      pGVar1 = pTemp;
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsBuf(pFan0);
        pGVar1 = pTemp;
        if (iVar3 == 0) {
          iVar3 = Gia_ObjIsMuxType(pFan0);
          pGVar1 = pGStack_10;
          if (iVar3 != 0) {
            iVar3 = Gia_ObjFaninId0(pFan0,local_5c);
            iVar3 = Gia_ObjSibl(pGVar1,iVar3);
            pGVar1 = pGStack_10;
            if (iVar3 == 0) {
              iVar3 = Gia_ObjFaninId1(pFan0,local_5c);
              iVar3 = Gia_ObjSibl(pGVar1,iVar3);
              if (iVar3 == 0) {
                iVar3 = Gia_ObjRecognizeExor(pFan0,&pFan1,&pFanC);
                pGVar2 = pGStack_10;
                pGVar1 = pTemp;
                if (iVar3 == 0) {
                  pGVar10 = Gia_ObjFanin0(pFan0);
                  iVar3 = Gia_ObjRefNum(pGVar2,pGVar10);
                  pGVar1 = pGStack_10;
                  pGVar10 = Gia_ObjFanin1(pFan0);
                  iVar6 = Gia_ObjRefNum(pGVar1,pGVar10);
                  pGVar1 = pTemp;
                  if (pNew._4_4_ < iVar3 + iVar6) {
                    iVar3 = Gia_ObjFanin0Copy(pFan0);
                    iVar6 = Gia_ObjFanin1Copy(pFan0);
                    uVar4 = Gia_ManHashAnd(pGVar1,iVar3,iVar6);
                    pFan0->Value = uVar4;
                  }
                  else {
                    pGVar10 = Gia_ObjRecognizeMux(pFan0,&pFanC,&pFan1);
                    pGVar2 = pGStack_10;
                    pGVar1 = pTemp;
                    iVar3 = Gia_ObjToLit(pGStack_10,pGVar10);
                    iVar3 = Gia_ObjLitCopy(pGVar2,iVar3);
                    pGVar2 = pGStack_10;
                    iVar6 = Gia_ObjToLit(pGStack_10,pFanC);
                    iVar6 = Gia_ObjLitCopy(pGVar2,iVar6);
                    pGVar2 = pGStack_10;
                    iVar5 = Gia_ObjToLit(pGStack_10,pFan1);
                    iVar5 = Gia_ObjLitCopy(pGVar2,iVar5);
                    uVar4 = Gia_ManHashMuxReal(pGVar1,iVar3,iVar6,iVar5);
                    pFan0->Value = uVar4;
                  }
                }
                else {
                  iVar3 = Gia_ObjToLit(pGStack_10,pFan1);
                  iVar3 = Gia_ObjLitCopy(pGVar2,iVar3);
                  pGVar2 = pGStack_10;
                  iVar6 = Gia_ObjToLit(pGStack_10,pFanC);
                  iVar6 = Gia_ObjLitCopy(pGVar2,iVar6);
                  uVar4 = Gia_ManHashXorReal(pGVar1,iVar3,iVar6);
                  pFan0->Value = uVar4;
                }
                goto LAB_00226e4d;
              }
            }
          }
          pGVar1 = pTemp;
          iVar3 = Gia_ObjFanin0Copy(pFan0);
          iVar6 = Gia_ObjFanin1Copy(pFan0);
          uVar4 = Gia_ManHashAnd(pGVar1,iVar3,iVar6);
          pFan0->Value = uVar4;
        }
        else {
          iVar3 = Gia_ObjFanin0Copy(pFan0);
          uVar4 = Gia_ManAppendBuf(pGVar1,iVar3);
          pFan0->Value = uVar4;
        }
      }
      else {
        iVar3 = Gia_ObjFanin0Copy(pFan0);
        uVar4 = Gia_ManAppendCo(pGVar1,iVar3);
        pFan0->Value = uVar4;
      }
    }
    else {
      uVar4 = Gia_ManAppendCi(pTemp);
      pFan0->Value = uVar4;
    }
LAB_00226e4d:
    iVar3 = Gia_ObjSibl(pGStack_10,local_5c);
    pGVar1 = pTemp;
    if (iVar3 != 0) {
      iVar3 = Abc_Lit2Var(pFan0->Value);
      pGVar10 = Gia_ManObj(pGVar1,iVar3);
      pGVar1 = pTemp;
      pGVar11 = Gia_ObjSiblObj(pGStack_10,local_5c);
      iVar3 = Abc_Lit2Var(pGVar11->Value);
      pGVar11 = Gia_ManObj(pGVar1,iVar3);
      iVar3 = Gia_ObjIsAnd(pGVar10);
      if ((iVar3 != 0) && (iVar3 = Gia_ObjIsAnd(pGVar11), iVar3 != 0)) {
        iVar3 = Gia_ObjId(pTemp,pGVar10);
        iVar6 = Gia_ObjId(pTemp,pGVar11);
        if (iVar6 < iVar3) {
          iVar3 = Gia_ObjId(pTemp,pGVar11);
          piVar9 = pTemp->pSibls;
          iVar6 = Gia_ObjId(pTemp,pGVar10);
          piVar9[iVar6] = iVar3;
        }
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupMuxes( Gia_Man_t * p, int Limit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC, * pSiblNew, * pObjNew;
    int i;
    assert( p->pMuxes == NULL );
    assert( Limit >= 0 ); // allows to create AIG with XORs without MUXes
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !Gia_ObjIsMuxType(pObj) || Gia_ObjSibl(p, Gia_ObjFaninId0(pObj, i)) || Gia_ObjSibl(p, Gia_ObjFaninId1(pObj, i)) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)) );
        else if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) + Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > Limit )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
        if ( !Gia_ObjSibl(p, i) )
            continue;
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        pSiblNew = Gia_ManObj( pNew, Abc_Lit2Var(Gia_ObjSiblObj(p, i)->Value) );
        if ( Gia_ObjIsAnd(pObjNew) && Gia_ObjIsAnd(pSiblNew) && Gia_ObjId(pNew, pObjNew) > Gia_ObjId(pNew, pSiblNew) )
            pNew->pSibls[Gia_ObjId(pNew, pObjNew)] = Gia_ObjId(pNew, pSiblNew);
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}